

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcCommon.h
# Opt level: O1

void o3dgc::CubeToSphere(Real a,Real b,char index,Real *x,Real *y,Real *z)

{
  undefined3 in_register_00000039;
  Real RVar1;
  double dVar2;
  
  switch(CONCAT31(in_register_00000039,index)) {
  case 0:
    *x = a;
    *y = b;
    dVar2 = (1.0 - (double)(*x * *x)) - (double)(b * b);
    if (dVar2 <= 0.0) {
      dVar2 = 0.0;
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    RVar1 = (Real)dVar2;
    break;
  case 1:
    *x = -a;
    *y = -b;
    dVar2 = (1.0 - (double)(*x * *x)) - (double)(b * b);
    if (dVar2 <= 0.0) {
      dVar2 = 0.0;
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    RVar1 = -(float)dVar2;
    break;
  case 2:
    *z = a;
    *x = b;
    dVar2 = (1.0 - (double)(b * b)) - (double)(*z * *z);
    if (dVar2 <= 0.0) {
      dVar2 = 0.0;
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    RVar1 = (Real)dVar2;
    goto LAB_0037aabd;
  case 3:
    *z = -a;
    *x = -b;
    dVar2 = (1.0 - (double)(b * b)) - (double)(*z * *z);
    if (dVar2 <= 0.0) {
      dVar2 = 0.0;
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    RVar1 = -(float)dVar2;
LAB_0037aabd:
    *y = RVar1;
    return;
  case 4:
    *y = a;
    *z = b;
    dVar2 = (1.0 - (double)(*y * *y)) - (double)(b * b);
    if (dVar2 <= 0.0) {
      dVar2 = 0.0;
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    RVar1 = (Real)dVar2;
    goto LAB_0037aaf5;
  case 5:
    *y = -a;
    *z = -b;
    dVar2 = (1.0 - (double)(*y * *y)) - (double)(b * b);
    if (dVar2 <= 0.0) {
      dVar2 = 0.0;
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    RVar1 = -(float)dVar2;
LAB_0037aaf5:
    *x = RVar1;
  default:
    goto switchD_0037a8b9_default;
  }
  *z = RVar1;
switchD_0037a8b9_default:
  return;
}

Assistant:

inline void CubeToSphere(const Real a, const Real b, const char index,
                             Real & x, Real & y, Real & z)
    {
        switch( index )
        {
        case 0:
            x = a;
            y = b;
            z =  (Real) sqrt(max(0.0, 1.0 - x*x-y*y));
            break;
        case 1:
            x = -a;
            y = -b;
            z = -(Real) sqrt(max(0.0, 1.0 - x*x-y*y));
            break;
        case 2:
            z = a;
            x = b;
            y =  (Real) sqrt(max(0.0, 1.0 - x*x-z*z));
            break;
        case 3:
            z = -a;
            x = -b;
            y = -(Real) sqrt(max(0.0, 1.0 - x*x-z*z));
            break;
        case 4:
            y = a;
            z = b;
            x =  (Real) sqrt(max(0.0, 1.0 - y*y-z*z));
            break;
        case 5:
            y = -a;
            z = -b;
            x = -(Real) sqrt(max(0.0, 1.0 - y*y-z*z));
            break;
        }
    }